

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
flow::convert<long,flow::ConstantValue<long,(flow::LiteralType)2>>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,flow *this,
          vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source)

{
  size_type sVar1;
  const_reference ppCVar2;
  long lVar3;
  reference pvVar4;
  size_t e;
  size_t i;
  allocator<long> local_1a;
  undefined1 local_19;
  flow *local_18;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *source_local;
  vector<long,_std::allocator<long>_> *target;
  
  local_19 = 0;
  local_18 = this;
  source_local = (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                 __return_storage_ptr__;
  sVar1 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::size
                    ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)this);
  std::allocator<long>::allocator(&local_1a);
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__,sVar1,&local_1a);
  std::allocator<long>::~allocator(&local_1a);
  e = 0;
  sVar1 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::size
                    ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)local_18);
  for (; e != sVar1; e = e + 1) {
    ppCVar2 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::operator[]
                        ((vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)local_18,e);
    lVar3 = ConstantValue<long,_(flow::LiteralType)2>::get
                      ((ConstantValue<long,_(flow::LiteralType)2> *)*ppCVar2);
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](__return_storage_ptr__,e);
    *pvVar4 = lVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> convert(const std::vector<Constant*>& source) {
  std::vector<T> target(source.size());

  for (size_t i = 0, e = source.size(); i != e; ++i)
    target[i] = static_cast<S*>(source[i])->get();

  return target;
}